

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createMemTransfer(LLVMPointerGraphBuilder *this,IntrinsicInst *I)

{
  int iVar1;
  Value *val;
  Value *val_00;
  long lVar2;
  uint64_t size;
  PSNode *pPVar3;
  raw_ostream *prVar4;
  undefined8 *puVar5;
  uint64_t lenVal;
  PSNode *srcNode;
  PSNode *destNode;
  uint64_t local_38;
  PSNode *local_30;
  PSNode *local_28;
  
  local_38 = Offset::UNKNOWN;
  iVar1 = *(int *)(*(long *)&I[-1].field_0x30 + 0x24);
  if ((iVar1 != 0xc2) && (iVar1 != 0xbf)) {
    prVar4 = (raw_ostream *)llvm::errs();
    prVar4 = llvm::raw_ostream::operator<<(prVar4,"ERR: unhandled mem transfer intrinsic");
    prVar4 = llvm::operator<<(prVar4,(Value *)I);
    llvm::raw_ostream::operator<<(prVar4,"\n");
    abort();
  }
  puVar5 = (undefined8 *)((long)I - (ulong)(uint)(*(int *)&I->field_0x14 << 5));
  val = (Value *)*puVar5;
  val_00 = (Value *)puVar5[4];
  lVar2 = puVar5[8];
  if ((lVar2 != 0) && (*(char *)(lVar2 + 0x10) == '\x10')) {
    local_38 = llvm::APInt::getLimitedValue((APInt *)(lVar2 + 0x18),0xffffffffffffffff);
  }
  local_28 = getOperand(this,val);
  local_30 = getOperand(this,val_00);
  pPVar3 = PointerGraph::
           create<(dg::pta::PSNodeType)20,dg::pta::PSNode*&,dg::pta::PSNode*&,unsigned_long&>
                     ((PointerGraph *)this,&local_30,&local_28,&local_38);
  return pPVar3;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createMemTransfer(const llvm::IntrinsicInst *I) {
    using namespace llvm;
    const Value *dest, *src; //, *lenVal;
    uint64_t lenVal = Offset::UNKNOWN;

    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
        dest = I->getOperand(0);
        src = I->getOperand(1);
        lenVal = llvmutils::getConstantValue(I->getOperand(2));
        break;
    default:
        errs() << "ERR: unhandled mem transfer intrinsic" << *I << "\n";
        abort();
    }

    PSNode *destNode = getOperand(dest);
    PSNode *srcNode = getOperand(src);
    PSNode *node = PS.create<PSNodeType::MEMCPY>(srcNode, destNode, lenVal);

    return node;
}